

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O3

void __thiscall TextReader::read_eol(TextReader *this)

{
  size_t *psVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  string local_38;
  
  if (this->current_line_index_ == 0) {
    iVar3 = (**this->_vptr_TextReader)(this);
    if ((char)iVar3 == '\0') {
      (*this->_vptr_TextReader[1])(this);
      this->current_line_index_ = this->current_line_index_ + 1;
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)&this->current_line_,0,(char *)(this->current_line_)._M_string_length,
                 0x112262);
    }
    this->current_token_pos_ = 0;
    this->current_token_len_ = 0;
    uVar4 = 0;
  }
  else {
    uVar4 = this->current_token_pos_;
  }
  psVar1 = &this->current_token_pos_;
  uVar2 = (this->current_line_)._M_string_length;
  if ((uVar4 == uVar2 - 1) && ((this->current_line_)._M_dataplus._M_p[uVar4] == '\r')) {
    *psVar1 = uVar2;
  }
  else if (uVar4 < uVar2) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Expect end of the line","")
    ;
    parse_error(this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      return;
    }
    operator_delete(local_38._M_dataplus._M_p);
    return;
  }
  if (this->current_line_index_ == 0) {
    iVar3 = (**this->_vptr_TextReader)(this);
    if ((char)iVar3 == '\0') {
      (*this->_vptr_TextReader[1])(this);
      this->current_line_index_ = this->current_line_index_ + 1;
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)&this->current_line_,0,(char *)(this->current_line_)._M_string_length,
                 0x112262);
    }
    *psVar1 = 0;
    this->current_token_len_ = 0;
  }
  iVar3 = (**this->_vptr_TextReader)(this);
  if ((char)iVar3 == '\0') {
    (*this->_vptr_TextReader[1])(this);
    this->current_line_index_ = this->current_line_index_ + 1;
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)&this->current_line_,0,(char *)(this->current_line_)._M_string_length,0x112262
              );
  }
  *psVar1 = 0;
  this->current_token_len_ = 0;
  return;
}

Assistant:

inline void skip_space() {
        while (current_token_pos_ < current_line_.size()) {
            if (current_line_[current_token_pos_] != ' ')
                break;
            current_token_pos_++;
            if (current_token_len_ > 0) {
                reset_token();
            };
        };
    }